

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# elfio_segment.hpp
# Opt level: O1

bool __thiscall
ELFIO::segment_impl<ELFIO::Elf32_Phdr>::load
          (segment_impl<ELFIO::Elf32_Phdr> *this,istream *stream,streampos header_offset,
          bool is_lazy_)

{
  bool bVar1;
  const_iterator __begin2;
  size_t sVar2;
  pointer paVar3;
  __mbstate_t _Var4;
  long lVar5;
  long lVar6;
  
  _Var4 = header_offset._M_state;
  lVar6 = header_offset._M_off;
  this->pstream = stream;
  this->is_lazy = is_lazy_;
  sVar2 = 0xffffffffffffffff;
  if ((this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_start ==
      (this->translator->addr_translations).
      super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>.
      _M_impl.super__Vector_impl_data._M_finish) {
    std::istream::seekg((long)stream,_S_beg);
    sVar2 = std::istream::tellg();
  }
  this->stream_size = sVar2;
  paVar3 = (this->translator->addr_translations).
           super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
           ._M_impl.super__Vector_impl_data._M_start;
  do {
    if (paVar3 == (this->translator->addr_translations).
                  super__Vector_base<ELFIO::address_translation,_std::allocator<ELFIO::address_translation>_>
                  ._M_impl.super__Vector_impl_data._M_finish) {
LAB_00107b97:
      std::istream::seekg(stream,lVar6,_Var4);
      std::istream::read((char *)stream,(long)&this->ph);
      this->is_offset_set = true;
      if ((this->is_lazy == false) && (this->is_loaded == false)) {
        bVar1 = load_data(this);
        return bVar1;
      }
      return true;
    }
    lVar5 = lVar6 - *(long *)paVar3;
    if ((*(long *)paVar3 <= lVar6) && (lVar5 < *(long *)(paVar3 + 0x10))) {
      lVar6 = lVar5 + *(long *)(paVar3 + 0x20);
      _Var4.__count = 0;
      _Var4.__value = (anon_union_4_2_91654ee9_for___value)0x0;
      goto LAB_00107b97;
    }
    paVar3 = paVar3 + 0x30;
  } while( true );
}

Assistant:

bool load( std::istream&  stream,
               std::streampos header_offset,
               bool           is_lazy_ ) override
    {
        pstream = &stream;
        is_lazy = is_lazy_;

        if ( translator->empty() ) {
            stream.seekg( 0, std::istream::end );
            set_stream_size( size_t( stream.tellg() ) );
        }
        else {
            set_stream_size( std::numeric_limits<size_t>::max() );
        }

        stream.seekg( ( *translator )[header_offset] );
        stream.read( reinterpret_cast<char*>( &ph ), sizeof( ph ) );

        is_offset_set = true;

        if ( !( is_lazy || is_loaded ) ) {
            return load_data();
        }

        return true;
    }